

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secant.c
# Opt level: O3

int bfgs_l_min(custom_function *funcpt,custom_gradient *funcgrad,double *xi,int N,int m,double *dx,
              double fsval,double maxstep,int MAXITER,int *niter,double eps,double gtol,double ftol,
              double xtol,double *xf)

{
  undefined8 uVar1;
  double *pdVar2;
  double *jac;
  int iVar3;
  ulong uVar4;
  undefined4 in_register_0000000c;
  ulong uVar5;
  int N_00;
  uint uVar6;
  double *pdVar7;
  size_t __size;
  void *pvVar8;
  int iVar9;
  size_t sVar10;
  undefined4 in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 extraout_XMM0_Dd;
  double dVar11;
  double dVar12;
  double local_168;
  double alpha;
  ulong local_158;
  double *local_150;
  size_t local_148;
  double *local_140;
  double local_138;
  double *local_130;
  double local_128;
  custom_gradient *local_120;
  double *local_118;
  double *local_110;
  double local_108;
  undefined8 uStack_100;
  undefined1 local_f8 [16];
  int local_dc;
  custom_function *local_d8;
  double *local_d0;
  double local_c8;
  double *local_c0;
  undefined1 local_b8 [16];
  double local_a0;
  double fxf;
  double local_90;
  ulong local_88;
  double *local_80;
  double *local_78;
  double *local_70;
  double *local_68;
  double *local_60;
  double local_58;
  void *local_50;
  double *local_48;
  ulong local_40;
  int local_34;
  
  local_40 = CONCAT44(in_register_0000000c,N);
  local_f8._8_4_ = in_XMM0_Dc;
  local_f8._0_8_ = fsval;
  local_f8._12_4_ = in_XMM0_Dd;
  pdVar7 = (double *)(long)N;
  sVar10 = (long)pdVar7 * 8;
  alpha = xtol;
  local_138 = ftol;
  local_128 = eps;
  local_120 = funcgrad;
  local_d8 = funcpt;
  local_90 = gtol;
  local_58 = maxstep;
  local_48 = (double *)malloc(sVar10);
  local_c0 = (double *)malloc(sVar10);
  local_78 = (double *)malloc(sVar10);
  fxf = (double)malloc(sVar10);
  local_130 = (double *)malloc(sVar10 * (long)pdVar7);
  local_50 = malloc(sVar10);
  __size = (long)m * (long)pdVar7 * 8;
  local_88 = (ulong)(uint)m;
  local_80 = pdVar7;
  local_d0 = (double *)malloc(__size);
  local_68 = (double *)malloc(__size);
  local_70 = (double *)malloc(sVar10);
  local_60 = (double *)malloc(sVar10);
  *niter = 0;
  if (local_128 < 0.0) {
    local_c8 = sqrt(local_128);
  }
  else {
    local_c8 = SQRT(local_128);
  }
  pdVar7 = local_c0;
  local_168 = 1.0;
  if (0 < (int)local_40) {
    uVar5 = 0;
    do {
      xi[uVar5] = dx[uVar5] * xi[uVar5];
      dx[uVar5] = 1.0 / dx[uVar5];
      uVar5 = uVar5 + 1;
    } while ((local_40 & 0xffffffff) != uVar5);
  }
  local_108 = (*local_d8->funcpt)(xi,(int)local_40,local_d8->params);
  uStack_100 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
  uVar5 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc) & 0x7fffffffffffffff;
  local_34 = 0;
  local_b8._8_4_ = (int)uVar5;
  local_b8._0_8_ = ABS(local_108);
  local_b8._12_4_ = (int)(uVar5 >> 0x20);
  if (1.79769313486232e+308 <= ABS(local_108)) {
    printf("Program Exiting as the function value exceeds the maximum double value");
    local_34 = 0xf;
  }
  if (NAN(local_108)) {
    printf("Program Exiting as the function returns NaN");
    local_34 = 0xf;
  }
  uVar6 = (uint)local_40;
  iVar3 = grad_fd(local_d8,local_120,xi,uVar6,dx,local_c8,local_48);
  pvVar8 = local_50;
  if (iVar3 == 0xf) {
    local_34 = 0xf;
  }
  if (local_58 <= 0.0) {
    dVar12 = 0.0;
    local_58 = 0.0;
    if (0 < (int)uVar6) {
      uVar5 = 0;
      dVar12 = 0.0;
      do {
        dVar11 = dx[uVar5];
        dVar12 = dVar12 + dVar11 * dVar11;
        local_58 = local_58 + dVar11 * xi[uVar5] * dVar11 * xi[uVar5];
        uVar5 = uVar5 + 1;
      } while ((local_40 & 0xffffffff) != uVar5);
    }
    if (dVar12 < 0.0) {
      dVar12 = sqrt(dVar12);
    }
    else {
      dVar12 = SQRT(dVar12);
    }
    if (local_58 < 0.0) {
      dVar11 = local_58;
      local_58 = dVar12;
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(local_58);
      local_58 = dVar12;
    }
    if (dVar11 < local_58) {
      dVar11 = local_58;
    }
    local_58 = dVar11 * 1000.0;
    uVar6 = (uint)local_40;
  }
  if ((int)uVar6 < 1) {
    dVar12 = array_max_abs(pdVar7,uVar6);
    iVar3 = local_34;
    if (dVar12 <= local_90 * 0.001) {
      iVar3 = 1;
    }
  }
  else {
    dVar12 = (double)local_b8._0_8_;
    if ((double)local_b8._0_8_ <= ABS((double)local_f8._0_8_)) {
      dVar12 = ABS((double)local_f8._0_8_);
    }
    uVar4 = (ulong)uVar6;
    uVar5 = 0;
    do {
      dVar11 = ABS(xi[uVar5]);
      if (ABS(xi[uVar5]) <= 1.0 / ABS(dx[uVar5])) {
        dVar11 = 1.0 / ABS(dx[uVar5]);
      }
      pdVar7[uVar5] = (ABS(local_48[uVar5]) * dVar11) / dVar12;
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
    iVar9 = (int)local_40;
    dVar12 = array_max_abs(pdVar7,iVar9);
    iVar3 = local_34;
    pvVar8 = local_50;
    if (dVar12 <= local_90 * 0.001) {
      if (iVar9 < 1) {
        iVar3 = 1;
        goto LAB_0012ff39;
      }
      uVar5 = 0;
      do {
        xf[uVar5] = xi[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
      iVar3 = 1;
      iVar9 = (int)local_40;
    }
    if (0 < iVar9) {
      sVar10 = uVar4 << 3;
      memcpy(local_78,xi,sVar10);
      local_a0 = local_108;
      memset(local_70,0,sVar10);
      memset(local_60,0,sVar10);
      pvVar8 = local_50;
      goto LAB_0012ff49;
    }
  }
LAB_0012ff39:
  local_a0 = local_108;
LAB_0012ff49:
  if (iVar3 == 0) {
    local_b8._0_8_ = dx;
    iVar3 = (int)local_40;
    uVar6 = ((int)local_88 + -1) * iVar3;
    local_158 = (ulong)uVar6;
    local_dc = (int)local_88 * iVar3;
    uVar5 = local_40 & 0xffffffff;
    local_f8._0_8_ = uVar5 * 8;
    local_150 = local_d0 + (int)uVar6;
    local_148 = (ulong)(iVar3 - 1) * 8 + 8;
    local_140 = local_68 + (int)uVar6;
    iVar9 = *niter;
    local_118 = local_d0 + (long)local_80;
    local_80 = local_68 + (long)local_80;
    local_110 = xi;
    do {
      jac = local_48;
      pdVar7 = local_130;
      if (MAXITER <= iVar9) {
        iVar3 = 4;
        break;
      }
      N_00 = (int)local_40;
      inithess_l(local_130,N_00,iVar9,local_70,local_60,(double *)local_b8._0_8_);
      dVar12 = fxf;
      pdVar2 = local_d0;
      bfgs_rec(pdVar7,N_00,iVar9,(int)local_88,jac,local_d0,local_68,(double *)fxf);
      scale((double *)dVar12,1,N_00,-1.0);
      if (0 < N_00) {
        memcpy(local_50,jac,local_f8._0_8_);
      }
      uVar1 = local_b8._0_8_;
      iVar3 = lnsrchmt(local_d8,local_120,local_78,&local_a0,jac,&local_168,(double *)fxf,N_00,
                       (double *)local_b8._0_8_,local_58,MAXITER,local_c8,local_138,local_90,alpha,
                       xf);
      iVar3 = stopcheck2_mt(local_a0,N_00,local_108,jac,(double *)uVar1,local_128,local_90,local_138
                            ,iVar3);
      pdVar7 = local_78;
      sVar10 = local_148;
      local_108 = local_a0;
      uStack_100 = 0;
      if (N_00 < 1) {
        iVar9 = *niter;
        if ((int)local_88 <= iVar9) goto LAB_001301fe;
      }
      else {
        uVar4 = 0;
        do {
          dVar12 = local_48[uVar4];
          dVar11 = *(double *)((long)local_50 + uVar4 * 8);
          local_70[uVar4] = xf[uVar4] - local_78[uVar4];
          local_60[uVar4] = dVar12 - dVar11;
          uVar4 = uVar4 + 1;
        } while (uVar5 != uVar4);
        iVar9 = *niter;
        if (iVar9 < (int)local_88) {
          if (N_00 < 1) goto LAB_0013029f;
          uVar1 = local_f8._0_8_;
          local_34 = iVar3;
          memcpy(pdVar2 + iVar9 * N_00,local_70,local_f8._0_8_);
          memcpy(local_68 + iVar9 * N_00,local_60,uVar1);
          iVar3 = local_34;
        }
        else {
LAB_001301fe:
          if (0 < (int)local_158) {
            uVar4 = 0;
            do {
              pdVar2[uVar4] = local_118[uVar4];
              local_68[uVar4] = local_80[uVar4];
              uVar4 = uVar4 + 1;
            } while (local_158 != uVar4);
          }
          if ((int)local_158 < local_dc) {
            local_34 = iVar3;
            memcpy(local_150,local_70,local_148);
            memcpy(local_140,local_60,sVar10);
            iVar3 = local_34;
          }
          if (N_00 < 1) goto LAB_0013029f;
        }
        uVar1 = local_f8._0_8_;
        memset((void *)fxf,0,local_f8._0_8_);
        memcpy(pdVar7,xf,uVar1);
      }
LAB_0013029f:
      iVar9 = iVar9 + 1;
      *niter = iVar9;
    } while (iVar3 == 0);
    dx = (double *)local_b8._0_8_;
    xi = local_110;
    pdVar7 = local_c0;
    pvVar8 = local_50;
  }
  if (0 < (int)local_40) {
    uVar5 = 0;
    do {
      xi[uVar5] = dx[uVar5] * xi[uVar5];
      dx[uVar5] = 1.0 / dx[uVar5];
      uVar5 = uVar5 + 1;
    } while ((local_40 & 0xffffffff) != uVar5);
  }
  free(local_48);
  free(pdVar7);
  free(local_78);
  free(local_130);
  free((void *)fxf);
  free(pvVar8);
  free(local_d0);
  free(local_68);
  free(local_70);
  free(local_60);
  return iVar3;
}

Assistant:

int bfgs_l_min(custom_function *funcpt, custom_gradient *funcgrad, double *xi, int N, int m, double *dx, double fsval,double maxstep, int MAXITER, int *niter,
		double eps,double gtol,double ftol,double xtol,double *xf)  {
	int rcode,gfdcode;
	int i,j,siter,retval;
	int ptr,iter;
	double dt1,dt2,alpha,fo;
	double fx,num,den,stop0,fxf,eps2;
	double *jac,*scheck,*xc,*H,*step,*jacf,*sk,*yk,*tsk,*tyk;

	jac = (double*) malloc(sizeof(double) *N);
	scheck = (double*) malloc(sizeof(double) *N);
	xc = (double*) malloc(sizeof(double) *N);
	step = (double*) malloc(sizeof(double) *N);
	H = (double*) malloc(sizeof(double) *N * N);
	jacf = (double*) malloc(sizeof(double) *N);
	sk = (double*) malloc(sizeof(double) * m * N);
	yk = (double*) malloc(sizeof(double) * m * N);
	tsk = (double*) malloc(sizeof(double) *N);
	tyk = (double*) malloc(sizeof(double) *N);

	/*
	 * Return Codes
	 *
	 * Codes 1,2,3 denote possible success.
	 * Codes 0 and 4 denote failure.
	 *
	 * 1 - df(x)/dx <= gtol achieved so xf may be the local minima.
	 * 2 - Distance between the last two steps is less than stol or |xf - xi| <= stol so xf may be the local minima.
	 * 3 - Global Step failed to locate a lower point than xi so xi may be the local minima.
	 * 4 - Iteration Limit exceeded. Convergence not achieved.
	 *
	 */

	rcode = 0;
	*niter = 0;
	siter = MAXITER;
	eps2 = sqrt(eps);

	alpha = 1.0;
	gfdcode = 0;
	
	//set values
	for(i = 0; i < N;++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	fx = FUNCPT_EVAL(funcpt, xi, N);
	if (fx >= DBL_MAX || fx <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		rcode = 15;
	}
	if (fx != fx) {
		printf("Program Exiting as the function returns NaN");
		rcode = 15;
	}
	fo = fx;

	gfdcode = grad_fd(funcpt,funcgrad,xi,N,dx,eps2,jac);
	if (gfdcode == 15) {
		rcode = 15;
	}

	if (maxstep <= 0.0) {
		maxstep = 1000.0;
		dt1 = dt2 = 0.0;
		for (i = 0; i < N; ++i) {
			dt1 += dx[i] * dx[i];
			dt2 += dx[i] * xi[i] * dx[i] * xi[i];
		}

		dt1 = sqrt(dt1);
		dt2 = sqrt(dt2);

		if (dt1 > dt2) {
			maxstep *= dt1;
		}
		else {
			maxstep *= dt2;
		}
	}


	//Check Stop0
	if (fabs(fx) > fabs(fsval)) {
			den = fabs(fx);
	} else {
			den = fabs(fsval);
	}
	for(i = 0; i < N;++i) {
		if (fabs(xi[i]) > 1.0 / fabs(dx[i])) {
			num = fabs(xi[i]);
		} else {
			num = 1.0 / fabs(dx[i]);
		}
		scheck[i] = fabs(jac[i]) * num / den;
	}

	stop0 = array_max_abs(scheck,N);

	if (stop0 <= gtol * 1e-03) {
		rcode = 1;
		for(i = 0; i < N;++i) {
			xf[i] = xi[i];
		}
	}

	//hessian_fd(funcpt,xi,N,dx,hess);
	//inithess_lower(L,N,fx,fsval,dx);

	for(i = 0; i < N;++i) {
		xc[i] = xi[i];
	}
	fxf = fx;

	for (i = 0; i < N; ++i) {
		tsk[i] = 0.0;
		tyk[i] = 0.0;
	}


	while (rcode == 0 && *niter < siter) {
		iter = *niter;
		inithess_l(H,N,iter,tsk,tyk,dx);

		bfgs_rec(H,N,iter,m,jac,sk,yk,step);
		//mdisplay(step,1,N);

		scale(step,1,N,-1.0);

		for (i = 0; i < N; ++i) {
			jacf[i] = jac[i];
		}

		//linsolve_lower(L,N,jac,step);

		//scale(jac,1,N,-1.0);
		//retval = lnsrchmod(funcpt,xc,jac,step,N,dx,maxstep,stol,xf,jacf);
		retval = lnsrchmt(funcpt,funcgrad, xc, &fxf, jac, &alpha, step, N, dx, maxstep,MAXITER,eps2,ftol, gtol, xtol, xf);
		//retval = lnsrch(funcpt,xc,jac,step,N,dx,maxstep,stol,xf);

		//retval = swolfe(funcpt,xc,jac,step,N,dx,maxstep,stol,xf);
		//printf("%g %g \n",fo,fxf);

		//grad_fd(funcpt,xf,N,dx,jacf);
		//rcode = stopcheck_mt(fxf, N, xc, xf, jac, dx, fsval, gtol, ftol, retval);
		rcode = stopcheck2_mt(fxf,N,fo,jac,dx,eps,gtol,ftol,retval);
		//rcode = stopcheck3_mt(xc,xf,fxf,N,fo,jac,dx,eps,gtol,ftol,retval);
		//printf("\n CODE %d", rcode);
		fo = fxf;
		for (i = 0; i < N;++i) {
			tsk[i] = xf[i] - xc[i];
			tyk[i] = jac[i] - jacf[i];
		}

		if (*niter >= m) {
			for (i = 0; i < (m-1) * N; ++i) {
				sk[i] = sk[N + i];
				yk[i] = yk[N + i];
			}
			j = 0;

			for (i = (m - 1) * N; i < m * N; ++i) {
				sk[i] = tsk[j];
				yk[i] = tyk[j];
				j++;
			}

		} else {
			ptr = *niter * N;

			for (i = 0; i < N;++i) {
				sk[ptr + i] = tsk[i];
				yk[ptr + i] = tyk[i];
			}

		}

		
		for(i = 0; i < N;++i) {
			xc[i] = xf[i];
			step[i] = 0.0;
		}
		*niter = *niter + 1;

	}

	//mdisplay(xc, 1, N);

	if (rcode == 0 && *niter >= siter) {
		rcode = 4;
	}
	
	for(i = 0; i < N;++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	


	free(jac);
	free(scheck);
	free(xc);
	free(H);
	free(step);
	free(jacf);
	free(sk);
	free(yk);
	free(tsk);
	free(tyk);
	return rcode;
}